

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void emit_return(JSParseState *s,BOOL hasval)

{
  int iVar1;
  int in_ESI;
  long in_RDI;
  int label_return;
  int label_next2;
  int label_next;
  int drop_count;
  BlockEnv *top;
  undefined4 in_stack_ffffffffffffffd8;
  undefined2 in_stack_ffffffffffffffdc;
  uint16_t in_stack_ffffffffffffffde;
  int in_stack_ffffffffffffffe0;
  int iVar2;
  uint8_t uVar4;
  undefined8 *puVar3;
  uint in_stack_fffffffffffffff0;
  
  iVar2 = 0;
  for (puVar3 = *(undefined8 **)(*(long *)(in_RDI + 0x68) + 0x180);
      uVar4 = (uint8_t)((ulong)puVar3 >> 0x38), puVar3 != (undefined8 *)0x0;
      puVar3 = (undefined8 *)*puVar3) {
    if (*(int *)(puVar3 + 4) != 0) {
      if (in_ESI == 0) {
        emit_op((JSParseState *)(ulong)in_stack_fffffffffffffff0,uVar4);
        in_ESI = 1;
      }
      emit_op((JSParseState *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
              (uint8_t)((ulong)puVar3 >> 0x38));
      uVar4 = (uint8_t)((ulong)puVar3 >> 0x38);
      if ((*(ushort *)(*(long *)(in_RDI + 0x68) + 0x84) & 0xff) == 3) {
        emit_op((JSParseState *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),uVar4);
        emit_op((JSParseState *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                (uint8_t)((ulong)puVar3 >> 0x38));
        emit_op((JSParseState *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                (uint8_t)((ulong)puVar3 >> 0x38));
        emit_atom((JSParseState *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
                  CONCAT22(in_stack_ffffffffffffffde,in_stack_ffffffffffffffdc));
        emit_op((JSParseState *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                (uint8_t)((ulong)puVar3 >> 0x38));
        emit_op((JSParseState *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                (uint8_t)((ulong)puVar3 >> 0x38));
        in_stack_ffffffffffffffe0 =
             emit_goto((JSParseState *)
                       CONCAT26(in_stack_ffffffffffffffde,
                                CONCAT24(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)),0,
                       0x1940a0);
        emit_op((JSParseState *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                (uint8_t)((ulong)puVar3 >> 0x38));
        emit_u16((JSParseState *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffde
                );
        emit_op((JSParseState *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                (uint8_t)((ulong)puVar3 >> 0x38));
        emit_op((JSParseState *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                (uint8_t)((ulong)puVar3 >> 0x38));
        iVar2 = emit_goto((JSParseState *)
                          CONCAT26(in_stack_ffffffffffffffde,
                                   CONCAT24(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)),0,
                          0x1940f1);
        in_stack_ffffffffffffffdc = (undefined2)iVar2;
        in_stack_ffffffffffffffde = (uint16_t)((uint)iVar2 >> 0x10);
        emit_label((JSParseState *)
                   CONCAT26(in_stack_ffffffffffffffde,
                            CONCAT24(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)),0);
        emit_op((JSParseState *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                (uint8_t)((ulong)puVar3 >> 0x38));
        emit_label((JSParseState *)
                   CONCAT26(in_stack_ffffffffffffffde,
                            CONCAT24(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)),0);
        emit_op((JSParseState *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                (uint8_t)((ulong)puVar3 >> 0x38));
      }
      else {
        emit_op((JSParseState *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),uVar4);
      }
      iVar2 = -3;
    }
    iVar2 = *(int *)((long)puVar3 + 0x14) + iVar2;
    if (*(int *)(puVar3 + 3) != -1) {
      for (; uVar4 = (uint8_t)((ulong)puVar3 >> 0x38), iVar2 != 0; iVar2 = iVar2 + -1) {
        emit_op((JSParseState *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),uVar4);
      }
      if (in_ESI == 0) {
        emit_op((JSParseState *)(ulong)in_stack_fffffffffffffff0,uVar4);
        in_ESI = 1;
      }
      emit_goto((JSParseState *)
                CONCAT26(in_stack_ffffffffffffffde,
                         CONCAT24(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)),0,0x1941cf);
    }
  }
  if (*(int *)(*(long *)(in_RDI + 0x68) + 0x78) == 0) {
    if ((*(ushort *)(*(long *)(in_RDI + 0x68) + 0x84) & 0xff) == 0) {
      emit_op((JSParseState *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),uVar4);
    }
    else {
      if (in_ESI == 0) {
        emit_op((JSParseState *)(ulong)in_stack_fffffffffffffff0,uVar4);
        uVar4 = (uint8_t)((ulong)puVar3 >> 0x38);
      }
      else {
        if ((*(ushort *)(*(long *)(in_RDI + 0x68) + 0x84) & 0xff) == 3) {
          emit_op((JSParseState *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),uVar4);
        }
        uVar4 = (uint8_t)((ulong)puVar3 >> 0x38);
      }
      emit_op((JSParseState *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),uVar4);
    }
  }
  else {
    if (in_ESI == 0) {
      iVar1 = -1;
    }
    else {
      emit_op((JSParseState *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),uVar4);
      iVar1 = emit_goto((JSParseState *)
                        CONCAT26(in_stack_ffffffffffffffde,
                                 CONCAT24(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)),0,
                        0x19421e);
      emit_op((JSParseState *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
              (uint8_t)((ulong)puVar3 >> 0x38));
    }
    uVar4 = (uint8_t)((ulong)puVar3 >> 0x38);
    emit_op((JSParseState *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),uVar4);
    emit_atom((JSParseState *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
              CONCAT22(in_stack_ffffffffffffffde,in_stack_ffffffffffffffdc));
    emit_u16((JSParseState *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffde);
    emit_label((JSParseState *)
               CONCAT26(in_stack_ffffffffffffffde,CONCAT24(in_stack_ffffffffffffffdc,iVar1)),0);
    emit_op((JSParseState *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),uVar4);
  }
  return;
}

Assistant:

static void emit_return(JSParseState *s, BOOL hasval)
{
    BlockEnv *top;
    int drop_count;

    drop_count = 0;
    top = s->cur_func->top_break;
    while (top != NULL) {
        /* XXX: emit the appropriate OP_leave_scope opcodes? Probably not
           required as all local variables will be closed upon returning
           from JS_CallInternal, but not in the same order. */
        if (top->has_iterator) {
            /* with 'yield', the exact number of OP_drop to emit is
               unknown, so we use a specific operation to look for
               the catch offset */
            if (!hasval) {
                emit_op(s, OP_undefined);
                hasval = TRUE;
            }
            emit_op(s, OP_iterator_close_return);
            if (s->cur_func->func_kind == JS_FUNC_ASYNC_GENERATOR) {
                int label_next, label_next2;

                emit_op(s, OP_drop); /* catch offset */
                emit_op(s, OP_drop); /* next */
                emit_op(s, OP_get_field2);
                emit_atom(s, JS_ATOM_return);
                /* stack: iter_obj return_func */
                emit_op(s, OP_dup);
                emit_op(s, OP_is_undefined_or_null);
                label_next = emit_goto(s, OP_if_true, -1);
                emit_op(s, OP_call_method);
                emit_u16(s, 0);
                emit_op(s, OP_iterator_check_object);
                emit_op(s, OP_await);
                label_next2 = emit_goto(s, OP_goto, -1);
                emit_label(s, label_next);
                emit_op(s, OP_drop);
                emit_label(s, label_next2);
                emit_op(s, OP_drop);
            } else {
                emit_op(s, OP_iterator_close);
            }
            drop_count = -3;
        }
        drop_count += top->drop_count;
        if (top->label_finally != -1) {
            while(drop_count) {
                /* must keep the stack top if hasval */
                emit_op(s, hasval ? OP_nip : OP_drop);
                drop_count--;
            }
            if (!hasval) {
                /* must push return value to keep same stack size */
                emit_op(s, OP_undefined);
                hasval = TRUE;
            }
            emit_goto(s, OP_gosub, top->label_finally);
        }
        top = top->prev;
    }
    if (s->cur_func->is_derived_class_constructor) {
        int label_return;

        /* 'this' can be uninitialized, so it may be accessed only if
           the derived class constructor does not return an object */
        if (hasval) {
            emit_op(s, OP_check_ctor_return);
            label_return = emit_goto(s, OP_if_false, -1);
            emit_op(s, OP_drop);
        } else {
            label_return = -1;
        }

        /* XXX: if this is not initialized, should throw the
           ReferenceError in the caller realm */
        emit_op(s, OP_scope_get_var);
        emit_atom(s, JS_ATOM_this);
        emit_u16(s, 0);

        emit_label(s, label_return);
        emit_op(s, OP_return);
    } else if (s->cur_func->func_kind != JS_FUNC_NORMAL) {
        if (!hasval) {
            emit_op(s, OP_undefined);
        } else if (s->cur_func->func_kind == JS_FUNC_ASYNC_GENERATOR) {
            emit_op(s, OP_await);
        }
        emit_op(s, OP_return_async);
    } else {
        emit_op(s, hasval ? OP_return : OP_return_undef);
    }
}